

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod_set.c
# Opt level: O3

char * acmod_set_id2s2name(acmod_set_t *acmod_set,acmod_id_t id)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  uint uVar4;
  char *pcVar5;
  word_posn_t posn;
  acmod_id_t right;
  acmod_id_t left;
  acmod_id_t base;
  word_posn_t local_40;
  acmod_id_t local_3c;
  acmod_id_t local_38;
  acmod_id_t local_34;
  
  if (id < acmod_set->n_ci) {
    pcVar5 = acmod_set->ci[id].name;
  }
  else {
    uVar4 = 0;
    if (id < acmod_set->next_id) {
      acmod_set_id2tri(acmod_set,&local_34,&local_38,&local_3c,&local_40,id);
      pcVar1 = acmod_set_id2name(acmod_set,local_34);
      pcVar2 = acmod_set_id2name(acmod_set,local_38);
      pcVar3 = acmod_set_id2name(acmod_set,local_3c);
      if ((long)(int)local_40 != 3) {
        uVar4 = (uint)"besiu"[(int)local_40];
      }
      pcVar5 = acmod_set_id2s2name::str;
      sprintf(acmod_set_id2s2name::str,"%s(%s,%s)%c",pcVar1,pcVar2,pcVar3,(ulong)uVar4);
    }
    else {
      pcVar5 = (char *)0x0;
    }
  }
  return pcVar5;
}

Assistant:

const char *
acmod_set_id2s2name(acmod_set_t *acmod_set,
		    acmod_id_t id)
{
    static char str[1024];
    char *pmap = WORD_POSN_CHAR_MAP;
    acmod_id_t base;
    acmod_id_t left;
    acmod_id_t right;
    word_posn_t posn;
    
    if (id < acmod_set->n_ci)
	return acmod_set->ci[id].name;
    
    else if (id < acmod_set->next_id) {

	acmod_set_id2tri(acmod_set, &base, &left, &right, &posn, id);

	sprintf(str, "%s(%s,%s)%c",
		acmod_set_id2name(acmod_set, base),
		acmod_set_id2name(acmod_set, left),
		acmod_set_id2name(acmod_set, right),
		(posn != WORD_POSN_INTERNAL ? pmap[(int)posn] : '\0'));
	
	return str;
    }
    else
	return NULL;
}